

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeMem(MCInst *MI,uint insn,uint64_t Address,void *Decoder,_Bool isLoad,DecodeFunc DecodeRD)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus DVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  byte in_R8B;
  MCInst *in_R9;
  uint simm13;
  uint rs2;
  _Bool isImm;
  uint rs1;
  uint rd;
  DecodeStatus status;
  uint uVar5;
  uint32_t uVar6;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar7;
  uint in_stack_ffffffffffffffc4;
  DecodeStatus local_4;
  
  uVar1 = fieldFromInstruction_4(in_ESI,0x19,5);
  uVar2 = fieldFromInstruction_4(in_ESI,0xe,5);
  uVar3 = fieldFromInstruction_4(in_ESI,0xd,1);
  uVar7 = CONCAT13(uVar3 != 0,(int3)in_stack_ffffffffffffffb8);
  uVar6 = 0;
  uVar5 = 0;
  if (uVar3 != 0) {
    uVar3 = fieldFromInstruction_4(in_ESI,0,0xd);
    uVar5 = SignExtend32(uVar3,0xd);
  }
  else {
    uVar6 = fieldFromInstruction_4(in_ESI,0,5);
  }
  if ((in_R8B & 1) != 0) {
    DVar4 = (*(code *)in_R9)(in_RDI,uVar1,in_RDX,in_RCX);
    if (DVar4 != MCDisassembler_Success) {
      return DVar4;
    }
    in_stack_ffffffffffffffc4 = 3;
  }
  local_4 = DecodeIntRegsRegisterClass
                      (in_R9,in_stack_ffffffffffffffc4,CONCAT44(uVar2,uVar7),
                       (void *)CONCAT44(uVar6,uVar5));
  if (local_4 == MCDisassembler_Success) {
    if ((uVar7 & 0x1000000) == 0) {
      DVar4 = DecodeIntRegsRegisterClass
                        (in_R9,3,CONCAT44(uVar2,uVar7),(void *)CONCAT44(uVar6,uVar5));
      if (DVar4 != MCDisassembler_Success) {
        return DVar4;
      }
    }
    else {
      MCOperand_CreateImm0(in_RDI,(ulong)uVar5);
    }
    if (((in_R8B & 1) != 0) ||
       (local_4 = (*(code *)in_R9)(in_RDI,uVar1,in_RDX,in_RCX), local_4 == MCDisassembler_Success))
    {
      local_4 = MCDisassembler_Success;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeMem(MCInst *Inst,
		unsigned Insn, uint64_t Address, const MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Reg = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);
	int opcode = MCInst_getOpcode(Inst);

	Reg = getReg(Decoder, Mips_GPR32RegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	if (opcode == Mips_SC || opcode == Mips_SCD) {
		MCOperand_CreateReg0(Inst, Reg);
	}

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}